

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

connection_context_t * create_connection_context(uv_os_sock_t sock,int is_server_connection)

{
  undefined1 *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  connection_context_t *pcVar5;
  undefined8 uVar6;
  ssize_t sVar7;
  connection_context_t *pcVar8;
  connection_context_t *extraout_RAX;
  int *piVar9;
  connection_context_t *extraout_RAX_00;
  connection_context_t *extraout_RAX_01;
  connection_context_t *extraout_RAX_02;
  uint extraout_EDX;
  uint uVar10;
  code *unaff_RBX;
  char *pcVar11;
  uint uVar12;
  undefined1 *puVar13;
  connection_context_t **ppcVar14;
  undefined8 *puVar15;
  ulong uVar16;
  undefined1 *puVar17;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_98 [16];
  connection_context_t *pcStack_88;
  connection_context_t *pcStack_80;
  connection_context_t *pcStack_78;
  connection_context_t *pcStack_70;
  connection_context_t *pcStack_68;
  undefined1 *puStack_60;
  connection_context_t *pcStack_58;
  uv_poll_cb local_28;
  long local_20;
  
  iVar4 = (int)&local_28;
  pcVar5 = (connection_context_t *)malloc(0x130);
  if (pcVar5 == (connection_context_t *)0x0) {
    create_connection_context_cold_3();
LAB_001b6216:
    create_connection_context_cold_1();
  }
  else {
    pcVar5->sock = sock;
    pcVar5->is_server_connection = is_server_connection;
    pcVar5->read = 0;
    pcVar5->sent = 0;
    pcVar5->open_handles = 0;
    pcVar5->got_fin = 0;
    pcVar5->sent_fin = 0;
    pcVar5->got_disconnect = 0;
    pcVar5->events = 0;
    pcVar5->delayed_events = 0;
    uVar6 = uv_default_loop();
    iVar3 = uv_poll_init(uVar6,pcVar5,sock);
    pcVar5->open_handles = pcVar5->open_handles + 1;
    (pcVar5->poll_handle).data = pcVar5;
    local_20 = (long)iVar3;
    local_28 = (uv_poll_cb)0x0;
    unaff_RBX = (code *)pcVar5;
    if (local_20 != 0) goto LAB_001b6216;
    uVar6 = uv_default_loop();
    iVar3 = uv_timer_init(uVar6,&pcVar5->timer_handle);
    pcVar5->open_handles = pcVar5->open_handles + 1;
    (pcVar5->timer_handle).data = pcVar5;
    local_20 = (long)iVar3;
    local_28 = (uv_poll_cb)0x0;
    if (local_20 == 0) {
      return pcVar5;
    }
  }
  puVar13 = (undefined1 *)&local_20;
  create_connection_context_cold_2();
  puVar1 = *(undefined1 **)puVar13;
  pcStack_68 = (connection_context_t *)(long)iVar4;
  pcStack_70 = (connection_context_t *)0x0;
  pcStack_58 = (connection_context_t *)unaff_RBX;
  if (pcStack_68 == (connection_context_t *)0x0) {
    uVar12 = *(uint *)((long)puVar1 + 0x124);
    if ((uVar12 & extraout_EDX) == 0) goto LAB_001b68d6;
    if ((~uVar12 & extraout_EDX) == 0) {
      puVar17 = puVar13;
      if ((extraout_EDX & 1) != 0) goto LAB_001b63cb;
switchD_001b640c_caseD_4:
      if ((extraout_EDX & 2) != 0) {
        if ((*(ulong *)((long)puVar1 + 0x108) < 0x10000) &&
           ((test_mode != '\x01' || (*(int *)((long)puVar1 + 0x110) == 0)))) {
          pcStack_78 = (connection_context_t *)0x1b64ac;
          iVar4 = rand();
          pcVar11 = (char *)unaff_RBX;
          switch(iVar4 % 7) {
          case 0:
          case 1:
            pcVar8 = (connection_context_t *)(0x10000 - *(long *)((long)puVar1 + 0x108));
            pcVar5 = (connection_context_t *)0x67;
            if (pcVar8 < (connection_context_t *)0x67) {
              pcVar5 = pcVar8;
            }
            pcStack_70 = (connection_context_t *)0x0;
            pcStack_68 = pcVar5;
            puStack_60 = puVar17;
            if ((long)pcVar5 < 1) goto LAB_001b6919;
            do {
              puVar13 = (undefined1 *)(ulong)*(uint *)((long)puVar1 + 0xf8);
              pcStack_78 = (connection_context_t *)0x1b6540;
              pcVar11 = (char *)send(*(uint *)((long)puVar1 + 0xf8),connection_poll_cb::buffer_2,
                                     (size_t)pcVar5,0);
              uVar10 = (uint)pcVar11;
              if (uVar10 != 0xffffffff) break;
              pcStack_78 = (connection_context_t *)0x1b654d;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            puVar17 = puStack_60;
            if ((int)uVar10 < 0) {
              pcStack_78 = (connection_context_t *)0x1b6845;
              piVar9 = __errno_location();
              unaff_RBX = (code *)pcVar11;
              if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                pcStack_78 = (connection_context_t *)0x1b6856;
                connection_poll_cb_cold_15();
                goto LAB_001b6856;
              }
LAB_001b6870:
              spurious_writable_wakeups = spurious_writable_wakeups + 1;
            }
            else {
              unaff_RBX = (code *)(ulong)(uVar10 & 0x7fffffff);
              pcStack_70 = (connection_context_t *)0x0;
              pcStack_68 = (connection_context_t *)unaff_RBX;
              if ((connection_context_t *)unaff_RBX == (connection_context_t *)0x0)
              goto LAB_001b6933;
              *(long *)((long)puVar1 + 0x108U) =
                   (long)&(((connection_context_t *)unaff_RBX)->poll_handle).data +
                   *(long *)((long)puVar1 + 0x108U);
              valid_writable_wakeups = valid_writable_wakeups + 1;
            }
            break;
          case 2:
          case 3:
            pcVar5 = (connection_context_t *)(0x10000 - *(long *)((long)puVar1 + 0x108));
            if ((connection_context_t *)0x4d1 < pcVar5) {
              pcVar5 = (connection_context_t *)0x4d2;
            }
            pcStack_70 = (connection_context_t *)0x0;
            pcStack_68 = pcVar5;
            puStack_60 = puVar17;
            if ((long)pcVar5 < 1) goto LAB_001b6926;
            pcVar11 = connection_poll_cb::buffer_3;
            do {
              puVar13 = (undefined1 *)(ulong)*(uint *)((long)puVar1 + 0xf8);
              pcStack_78 = (connection_context_t *)0x1b66bb;
              sVar7 = send(*(uint *)((long)puVar1 + 0xf8),connection_poll_cb::buffer_3,
                           (size_t)pcVar5,0);
              uVar10 = (uint)sVar7;
              if (uVar10 != 0xffffffff) break;
              pcStack_78 = (connection_context_t *)0x1b66c9;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            if ((int)uVar10 < 0) {
LAB_001b6856:
              pcStack_78 = (connection_context_t *)0x1b685b;
              piVar9 = __errno_location();
              unaff_RBX = (code *)pcVar11;
              puVar17 = puStack_60;
              if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto LAB_001b6870;
              goto LAB_001b6952;
            }
            pcStack_68 = (connection_context_t *)(ulong)(uVar10 & 0x7fffffff);
            pcStack_70 = (connection_context_t *)0x0;
            unaff_RBX = (code *)pcVar11;
            if (pcStack_68 == (connection_context_t *)0x0) goto LAB_001b6940;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar16 = (long)&(pcStack_68->poll_handle).data + *(long *)((long)puVar1 + 0x108);
            *(ulong *)((long)puVar1 + 0x108) = uVar16;
            while (puVar17 = puStack_60, uVar16 < 0x10000) {
              unaff_RBX = (code *)(0x10000 - uVar16);
              if (uVar16 < 0xfb2f) {
                unaff_RBX = (code *)0x4d2;
              }
              pcStack_70 = (connection_context_t *)0x0;
              pcStack_68 = (connection_context_t *)unaff_RBX;
              if ((long)unaff_RBX < 1) goto LAB_001b68fa;
              do {
                pcStack_78 = (connection_context_t *)0x1b676f;
                sVar7 = send(*(int *)((long)puVar1 + 0xf8),connection_poll_cb::buffer_3,
                             (size_t)unaff_RBX,0);
                uVar10 = (uint)sVar7;
                if (uVar10 != 0xffffffff) break;
                pcStack_78 = (connection_context_t *)0x1b677d;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              if (uVar10 == 0) {
LAB_001b68c4:
                pcStack_78 = (connection_context_t *)0x1b68c9;
                connection_poll_cb_cold_10();
                goto LAB_001b68c9;
              }
              if ((int)uVar10 < 0) {
                pcStack_78 = (connection_context_t *)0x1b68a6;
                piVar9 = __errno_location();
                puVar17 = puStack_60;
                if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                  pcStack_78 = (connection_context_t *)0x1b68c4;
                  connection_poll_cb_cold_11();
                  goto LAB_001b68c4;
                }
                break;
              }
              uVar16 = (ulong)(uVar10 & 0x7fffffff) + *(long *)((long)puVar1 + 0x108);
              *(ulong *)((long)puVar1 + 0x108) = uVar16;
            }
            break;
          case 4:
            break;
          case 5:
            uVar12 = uVar12 & 0xfffffffd;
            unaff_RBX = (code *)((long)puVar1 + 0x80);
            pcStack_78 = (connection_context_t *)0x1b67f8;
            iVar4 = uv_is_active(unaff_RBX);
            if (iVar4 == 0) {
              *(undefined4 *)((long)puVar1 + 0x128) = 2;
              pcStack_78 = (connection_context_t *)0x1b689c;
              uv_timer_start(unaff_RBX,delay_timer_cb,100,0);
            }
            else {
              *(byte *)((long)puVar1 + 0x128U) = *(byte *)((long)puVar1 + 0x128U) | 2;
            }
            break;
          case 6:
            unaff_RBX = connection_poll_cb;
            pcStack_78 = (connection_context_t *)0x1b6820;
            uv_poll_start(puVar1,1,connection_poll_cb);
            pcStack_78 = (connection_context_t *)0x1b6830;
            uv_poll_start(puVar1,2,connection_poll_cb);
            *(undefined4 *)((long)puVar1 + 0x124) = 2;
            break;
          default:
            goto switchD_001b64e8_default;
          }
        }
        else {
          pcStack_78 = (connection_context_t *)0x1b62cb;
          iVar4 = shutdown(*(int *)((long)puVar1 + 0xf8),1);
          pcStack_68 = (connection_context_t *)(long)iVar4;
          pcStack_70 = (connection_context_t *)0x0;
          if (pcStack_68 != (connection_context_t *)0x0) goto LAB_001b68ed;
          *(undefined4 *)((long)puVar1 + 0x11c) = 1;
          uVar12 = uVar12 & 0xfffffffd;
          pcStack_68 = (connection_context_t *)0x0;
        }
      }
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)((long)puVar1 + 0x120) = 1;
        disconnects = disconnects + 1;
        uVar12 = uVar12 & 0xfffffffb;
      }
      if (((*(int *)((long)puVar1 + 0x118) == 0) || (*(int *)((long)puVar1 + 0x11c) == 0)) ||
         (*(int *)((long)puVar1 + 0x120) == 0)) {
        if (uVar12 != *(uint *)((long)puVar1 + 0x124)) {
          *(uint *)((long)puVar1 + 0x124) = uVar12;
          pcStack_78 = (connection_context_t *)0x1b638a;
          uv_poll_start(puVar17,uVar12,connection_poll_cb);
        }
      }
      else {
        pcStack_78 = (connection_context_t *)0x1b633b;
        close_socket(*(uv_os_sock_t *)((long)puVar1 + 0xf8));
        unaff_RBX = connection_close_cb;
        pcStack_78 = (connection_context_t *)0x1b634d;
        uv_close(puVar1,connection_close_cb);
        pcStack_78 = (connection_context_t *)0x1b635c;
        uv_close((long)puVar1 + 0x80,connection_close_cb);
        *(undefined4 *)((long)puVar1 + 0x124) = 0;
      }
      if (*(int *)((long)puVar1 + 0x124) == 0) {
        pcStack_78 = (connection_context_t *)0x1b647a;
        iVar4 = uv_is_active(puVar17);
        pcStack_68 = (connection_context_t *)(long)iVar4;
        pcStack_70 = (connection_context_t *)0x0;
        if (pcStack_68 == (connection_context_t *)0x0) {
          return (connection_context_t *)0x0;
        }
        goto LAB_001b68e0;
      }
      pcStack_68 = (connection_context_t *)0x1;
      pcStack_78 = (connection_context_t *)0x1b63a9;
      iVar4 = uv_is_active(puVar17);
      pcStack_70 = (connection_context_t *)(long)iVar4;
      if (pcStack_68 == pcStack_70) {
        return pcStack_68;
      }
      puVar13 = (undefined1 *)&pcStack_68;
      pcStack_78 = (connection_context_t *)0x1b63cb;
      connection_poll_cb_cold_17();
LAB_001b63cb:
      pcStack_78 = (connection_context_t *)0x1b63d0;
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        do {
          puVar13 = (undefined1 *)(ulong)*(uint *)((long)puVar1 + 0xf8);
          pcStack_78 = (connection_context_t *)0x1b642b;
          sVar7 = recv(*(uint *)((long)puVar1 + 0xf8),connection_poll_cb::buffer,0x4a,0);
          iVar4 = (int)sVar7;
          if (iVar4 != -1) break;
          pcStack_78 = (connection_context_t *)0x1b6439;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        pcStack_68 = (connection_context_t *)(long)iVar4;
        pcStack_70 = (connection_context_t *)0x0;
        unaff_RBX = (code *)connection_poll_cb::buffer;
        if ((long)pcStack_68 < 0) goto LAB_001b6907;
        if (iVar4 < 1) goto LAB_001b65f5;
        *(long *)((long)puVar1 + 0x100U) =
             *(long *)((long)puVar1 + 0x100U) + (long)&(pcStack_68->poll_handle).data;
        goto switchD_001b640c_caseD_4;
      case 2:
      case 3:
LAB_001b659a:
        puVar13 = (undefined1 *)(ulong)*(uint *)((long)puVar1 + 0xf8);
        pcStack_78 = (connection_context_t *)0x1b65b0;
        unaff_RBX = (code *)recv(*(uint *)((long)puVar1 + 0xf8),connection_poll_cb::buffer_1,0x3a3,0
                                );
        uVar10 = (uint)unaff_RBX;
        if (uVar10 == 0xffffffff) goto code_r0x001b65b8;
        goto LAB_001b65c2;
      case 4:
        goto switchD_001b640c_caseD_4;
      case 5:
        uVar12 = uVar12 & 0xfffffffe;
        unaff_RBX = (code *)((long)puVar1 + 0x80);
        pcStack_78 = (connection_context_t *)0x1b661a;
        puVar13 = unaff_RBX;
        iVar4 = uv_is_active();
        if (iVar4 == 0) {
          *(undefined4 *)((long)puVar1 + 0x128) = 1;
          pcStack_78 = (connection_context_t *)0x1b67e1;
          puVar13 = unaff_RBX;
          uv_timer_start(unaff_RBX,delay_timer_cb,10,0);
        }
        else {
          *(byte *)((long)puVar1 + 0x128U) = *(byte *)((long)puVar1 + 0x128U) | 1;
        }
        goto switchD_001b640c_caseD_4;
      case 6:
        unaff_RBX = connection_poll_cb;
        pcStack_78 = (connection_context_t *)0x1b6646;
        uv_poll_start(puVar1,2,connection_poll_cb);
        pcStack_78 = (connection_context_t *)0x1b6656;
        puVar13 = puVar1;
        uv_poll_start(puVar1,1,connection_poll_cb);
        *(undefined4 *)((long)puVar1 + 0x124) = 1;
        goto switchD_001b640c_caseD_4;
      default:
        goto switchD_001b640c_default;
      }
    }
  }
  else {
LAB_001b68c9:
    pcStack_78 = (connection_context_t *)0x1b68d6;
    connection_poll_cb_cold_1();
LAB_001b68d6:
    pcStack_78 = (connection_context_t *)0x1b68db;
    connection_poll_cb_cold_19();
  }
  pcStack_78 = (connection_context_t *)0x1b68e0;
  connection_poll_cb_cold_2();
LAB_001b68e0:
  pcStack_78 = (connection_context_t *)0x1b68ed;
  connection_poll_cb_cold_18();
LAB_001b68ed:
  pcStack_78 = (connection_context_t *)0x1b68fa;
  connection_poll_cb_cold_6();
LAB_001b68fa:
  pcStack_78 = (connection_context_t *)0x1b6907;
  connection_poll_cb_cold_9();
LAB_001b6907:
  pcStack_78 = (connection_context_t *)0x1b6914;
  connection_poll_cb_cold_4();
switchD_001b640c_default:
  pcStack_78 = (connection_context_t *)0x1b6919;
  connection_poll_cb_cold_5();
LAB_001b6919:
  pcStack_78 = (connection_context_t *)0x1b6926;
  connection_poll_cb_cold_13();
LAB_001b6926:
  pcStack_78 = (connection_context_t *)0x1b6933;
  connection_poll_cb_cold_7();
LAB_001b6933:
  pcStack_78 = (connection_context_t *)0x1b6940;
  connection_poll_cb_cold_14();
LAB_001b6940:
  puVar13 = (undefined1 *)&pcStack_68;
  pcStack_78 = (connection_context_t *)0x1b694d;
  connection_poll_cb_cold_8();
  pcVar11 = (char *)unaff_RBX;
switchD_001b64e8_default:
  pcStack_78 = (connection_context_t *)0x1b6952;
  connection_poll_cb_cold_16();
LAB_001b6952:
  pcStack_78 = (connection_context_t *)close_socket;
  connection_poll_cb_cold_12();
  pcStack_80 = (connection_context_t *)0x1b695d;
  pcStack_78 = extraout_RAX;
  iVar4 = close((int)puVar13);
  if (iVar4 == 0) {
    return pcStack_78;
  }
  pcStack_80 = (connection_context_t *)0x1b6966;
  piVar9 = __errno_location();
  if (*piVar9 == 0x68) {
    return pcStack_78;
  }
  pcStack_80 = (connection_context_t *)delay_timer_cb;
  close_socket_cold_1();
  lVar2 = *(long *)puVar13;
  auStack_98._0_8_ = (void *)0x1b697f;
  pcStack_80 = (connection_context_t *)pcVar11;
  iVar4 = uv_is_active();
  pcStack_88 = (connection_context_t *)(long)iVar4;
  auStack_98._8_8_ = (uv_loop_t *)0x0;
  if (pcStack_88 == (connection_context_t *)0x0) {
    if (*(uint *)(lVar2 + 0x128) == 0) goto LAB_001b69f5;
    uVar12 = *(uint *)(lVar2 + 0x128) | *(uint *)(lVar2 + 0x124);
    *(uint *)(lVar2 + 0x124) = uVar12;
    *(undefined4 *)(lVar2 + 0x128) = 0;
    auStack_98._0_8_ = (void *)0x1b69c8;
    iVar4 = uv_poll_start(lVar2,uVar12,connection_poll_cb);
    pcStack_88 = (connection_context_t *)(long)iVar4;
    auStack_98._8_8_ = (uv_loop_t *)0x0;
    if (pcStack_88 == (connection_context_t *)0x0) {
      return pcStack_88;
    }
  }
  else {
    auStack_98._0_8_ = (void *)0x1b69f5;
    delay_timer_cb_cold_1();
LAB_001b69f5:
    auStack_98._0_8_ = (void *)0x1b69fa;
    delay_timer_cb_cold_3();
  }
  ppcVar14 = &pcStack_88;
  auStack_98._0_8_ = connection_close_cb;
  delay_timer_cb_cold_2();
  pcVar5 = *ppcVar14;
  piVar9 = &pcVar5->open_handles;
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return extraout_RAX_00;
  }
  if ((test_mode == '\x01') && (pcVar5->is_server_connection == 0)) {
    auStack_98._0_8_ = pcVar5->read;
    if ((void *)auStack_98._0_8_ != (void *)0x0) {
      connection_close_cb_cold_2();
LAB_001b6af8:
      connection_close_cb_cold_1();
      goto LAB_001b6b07;
    }
  }
  else {
    auStack_98._0_8_ = pcVar5->read;
    if ((void *)auStack_98._0_8_ != (void *)0x10000) goto LAB_001b6af8;
  }
  if ((test_mode != '\0') && (pcVar5->is_server_connection != 0)) {
    auStack_98._0_8_ = pcVar5->sent;
    if ((void *)auStack_98._0_8_ == (void *)0x0) goto LAB_001b6ab5;
    pcVar5 = (connection_context_t *)auStack_98;
    connection_close_cb_cold_3();
  }
  auStack_98._0_8_ = pcVar5->sent;
  if ((void *)auStack_98._0_8_ != (void *)0x10000) {
LAB_001b6b07:
    puVar15 = (undefined8 *)auStack_98;
    connection_close_cb_cold_4();
    free((void *)*puVar15);
    return extraout_RAX_02;
  }
LAB_001b6ab5:
  closed_connections = closed_connections + 1;
  free(pcVar5);
  return extraout_RAX_01;
code_r0x001b65b8:
  pcStack_78 = (connection_context_t *)0x1b65bd;
  piVar9 = __errno_location();
  if (*piVar9 == 4) goto LAB_001b659a;
LAB_001b65c2:
  if (0 < (int)uVar10) {
    *(ulong *)((long)puVar1 + 0x100U) =
         *(long *)((long)puVar1 + 0x100U) + (ulong)(uVar10 & 0x7fffffff);
    goto LAB_001b659a;
  }
  if (uVar10 != 0) {
    pcStack_78 = (connection_context_t *)0x1b65dc;
    piVar9 = __errno_location();
    if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto switchD_001b640c_caseD_4;
    pcStack_78 = (connection_context_t *)0x1b65f5;
    connection_poll_cb_cold_3();
  }
LAB_001b65f5:
  *(undefined4 *)((long)puVar1 + 0x118) = 1;
  uVar12 = uVar12 & 0xfffffffe;
  goto switchD_001b640c_caseD_4;
}

Assistant:

static connection_context_t* create_connection_context(
    uv_os_sock_t sock, int is_server_connection) {
  int r;
  connection_context_t* context;

  context = (connection_context_t*) malloc(sizeof *context);
  ASSERT_NOT_NULL(context);

  context->sock = sock;
  context->is_server_connection = is_server_connection;
  context->read = 0;
  context->sent = 0;
  context->open_handles = 0;
  context->events = 0;
  context->delayed_events = 0;
  context->got_fin = 0;
  context->sent_fin = 0;
  context->got_disconnect = 0;

  r = uv_poll_init(uv_default_loop(), &context->poll_handle, sock);
  context->open_handles++;
  context->poll_handle.data = context;
  ASSERT_OK(r);

  r = uv_timer_init(uv_default_loop(), &context->timer_handle);
  context->open_handles++;
  context->timer_handle.data = context;
  ASSERT_OK(r);

  return context;
}